

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFFile.cpp
# Opt level: O2

void __thiscall Preferences::PDFFile::render(PDFFile *this,bool shown)

{
  bool bVar1;
  undefined7 in_register_00000031;
  path path;
  string pdfFilePath;
  path local_80;
  string local_58;
  string local_38;
  
  if ((int)CONCAT71(in_register_00000031,shown) != 0) {
    if (!render::wasShown) {
      ::PDFFile::operator=(&this->pdfFileCopy,this->pdfFile);
    }
    ImGui::Text("PDF file settings");
    std::filesystem::__cxx11::path::string(&local_58,&this->pdfFile->path);
    bVar1 = ImGui::InputText("PDF File",&local_58,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
    if (bVar1) {
      std::filesystem::__cxx11::path::operator=(&this->pdfFile->path,&local_58);
    }
    ImGui::SameLine(0.0,-1.0);
    local_80._M_pathname._M_dataplus._M_p = (pointer)0x0;
    bVar1 = ImGui::Button("Browse##pdfFilePath",(ImVec2 *)&local_80);
    if (bVar1) {
      show_file_picker_abi_cxx11_(&local_80,false);
      if (local_80._M_pathname._M_string_length != 0) {
        std::filesystem::__cxx11::path::string(&local_38,&local_80);
        std::__cxx11::string::operator=((string *)&local_58,(string *)&local_38);
        std::__cxx11::string::~string((string *)&local_38);
        std::filesystem::__cxx11::path::operator=(&this->pdfFile->path,&local_80);
      }
      std::filesystem::__cxx11::path::~path(&local_80);
    }
    std::__cxx11::string::~string((string *)&local_58);
  }
  render::wasShown = shown;
  return;
}

Assistant:

void PDFFile::render(bool shown) {
	static bool wasShown = false;

	if (shown) {
		if (!wasShown) { // Panel just got opened
			pdfFileCopy = pdfFile; // Make a copy to be able to restore if cancelled
		}

		ImGui::Text("PDF file settings");

		std::string pdfFilePath = pdfFile.path.string();
		if (ImGui::InputText("PDF File", &pdfFilePath)) {
			pdfFile.path = pdfFilePath;
		}
		ImGui::SameLine();
		if (ImGui::Button("Browse##pdfFilePath")) {
			auto path = show_file_picker();
			if (!path.empty()) {
				pdfFilePath = path.string();
				pdfFile.path = path;
			}
		}
	}

	wasShown = shown;
}